

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamSample.hpp
# Opt level: O3

void TasDREAM::SampleDREAM<(TasDREAM::TypeSamplingForm)1>
               (int num_burnup,int num_collect,DreamPDF *probability_distribution,
               DreamDomain *inside,TasmanianDREAM *state,
               function<void_(std::vector<double,_std::allocator<double>_>_&)> *independent_update,
               function<double_()> *differential_update,function<double_()> *get_random01)

{
  long lVar1;
  byte bVar2;
  void *pvVar3;
  TasmanianDREAM *pTVar4;
  _Any_data *p_Var5;
  bool bVar6;
  ulong uVar7;
  runtime_error *this;
  vector *pvVar8;
  vector *pvVar9;
  pointer __src;
  int iVar10;
  double *pdVar11;
  vector *pvVar12;
  double dVar13;
  undefined1 auVar14 [16];
  vector<double,_std::allocator<double>_> candidates;
  vector<double,_std::allocator<double>_> values;
  vector<double,_std::allocator<double>_> new_values;
  unsigned_long __n2;
  int local_1b0;
  allocator_type local_1a9;
  vector<double,_std::allocator<double>_> local_1a8;
  pointer local_190;
  int local_184;
  vector *local_180;
  vector<double,_std::allocator<double>_> local_178;
  double local_158;
  vector<double,_std::allocator<double>_> local_148;
  ulong local_128;
  long local_120;
  TasmanianDREAM *local_118;
  int local_10c;
  void *local_108 [2];
  long local_f8;
  _Any_data *local_f0;
  size_type local_e8;
  vector *local_e0;
  long local_d8;
  ulong local_d0;
  vector *local_c8;
  ulong local_c0;
  vector<bool,_std::allocator<bool>_> local_b8;
  _Any_data *local_90;
  _Any_data *local_88;
  size_t local_80;
  long local_78;
  double local_70;
  double local_68;
  double dStack_60;
  _Any_data local_50;
  code *local_40;
  
  uVar7 = *(ulong *)state;
  if ((uVar7 & 0xffffffff) != 0) {
    local_184 = num_burnup;
    local_128 = uVar7;
    local_f0 = (_Any_data *)probability_distribution;
    local_88 = (_Any_data *)inside;
    if (state[0x10] == (TasmanianDREAM)0x0) {
LAB_0010acc7:
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,
                 "ERROR: DREAM sampling requires that the setState() has been called first on the TasmanianDREAM."
                );
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar1 = *(long *)(state + 8);
    if (state[0x11] == (TasmanianDREAM)0x0) {
      std::
      function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
      ::function((function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
                  *)&local_50,probability_distribution);
      TasDREAM::TasmanianDREAM::setPDFvalues(state,&local_50);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
    }
    if (0 < num_collect) {
      TasDREAM::TasmanianDREAM::expandHistory((int)state);
    }
    local_10c = 0;
    if (0 < local_184) {
      local_10c = local_184;
    }
    if (num_collect < 1) {
      num_collect = 0;
    }
    local_10c = num_collect + local_10c;
    if (local_10c != 0) {
      iVar10 = (int)uVar7;
      local_180 = (vector *)(long)iVar10;
      auVar14._8_4_ = iVar10 >> 0x1f;
      auVar14._0_8_ = local_180;
      auVar14._12_4_ = 0x45300000;
      dStack_60 = auVar14._8_8_ - 1.9342813113834067e+25;
      local_128 = local_128 << 0x20;
      local_78 = lVar1 << 0x20;
      local_c0 = (ulong)(int)lVar1;
      local_68 = dStack_60 + ((double)CONCAT44(0x43300000,iVar10) - 4503599627370496.0);
      local_e8 = local_c0 * (long)local_180;
      local_80 = local_78 >> 0x1d;
      local_c8 = local_180 + (local_180 == (vector *)0x0);
      local_e0 = local_180 + -1;
      local_d0 = 0x800000000000003f;
      local_1b0 = 0;
      local_118 = state;
      local_90 = (_Any_data *)independent_update;
LAB_0010a6f7:
      local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (double *)0x0;
      local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::reserve(&local_178,local_e8);
      pvVar9 = local_180;
      std::vector<double,_std::allocator<double>_>::reserve(&local_148,(size_type)local_180);
      local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start._0_1_ = 1;
      std::vector<bool,_std::allocator<bool>_>::vector
                (&local_b8,(size_type)pvVar9,(bool *)&local_1a8,(allocator_type *)local_108);
      p_Var5 = local_88;
      if (local_128 != 0) {
        pvVar9 = (vector *)0x0;
        do {
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_1a8,local_c0,(allocator_type *)local_108);
          if ((get_random01->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_0010acb8:
            std::__throw_bad_function_call();
            goto LAB_0010acbd;
          }
          local_158 = (*get_random01->_M_invoker)((_Any_data *)get_random01);
          if ((get_random01->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_0010acb3:
            std::__throw_bad_function_call();
            goto LAB_0010acb8;
          }
          dVar13 = (*get_random01->_M_invoker)((_Any_data *)get_random01);
          uVar7 = (ulong)(local_158 * local_68);
          pvVar8 = (vector *)
                   ((long)(local_158 * local_68 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f |
                   uVar7);
          if (local_180 <= pvVar8) {
            pvVar8 = local_e0;
          }
          uVar7 = (ulong)(dVar13 * local_68);
          pvVar12 = (vector *)
                    ((long)(dVar13 * local_68 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7
                    );
          if (local_180 <= pvVar12) {
            pvVar8 = local_e0;
          }
          if ((differential_update->super__Function_base)._M_manager == (_Manager_type)0x0)
          goto LAB_0010acb3;
          dVar13 = (*differential_update->_M_invoker)((_Any_data *)differential_update);
          TasDREAM::TasmanianDREAM::getIJKdelta
                    ((ulong)state,(ulong)pvVar9,(ulong)pvVar8,dVar13,pvVar12);
          if ((*(long *)((long)independent_update + 0x10) == 0) ||
             ((**(code **)((long)independent_update + 0x18))
                        ((_Any_data *)independent_update,&local_1a8), *(long *)(p_Var5 + 1) == 0))
          goto LAB_0010acb3;
          bVar6 = (**(code **)((long)p_Var5 + 0x18))(p_Var5,&local_1a8);
          if (bVar6) {
            std::vector<double,std::allocator<double>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                      ((vector<double,std::allocator<double>> *)&local_178,
                       local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                       CONCAT71(local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start._1_7_,
                                local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_1_),
                       local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            std::vector<double,_std::allocator<double>_>::resize
                      (&local_148,
                       ((long)local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3) + 1);
          }
          else {
            pvVar8 = pvVar9 + 0x3f;
            if (-1 < (long)pvVar9) {
              pvVar8 = pvVar9;
            }
            bVar2 = (byte)pvVar9 & 0x3f;
            local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p
            [((long)pvVar8 >> 6) + ((ulong)(((ulong)pvVar9 & local_d0) < 0x8000000000000001) - 1)] =
                 local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)pvVar8 >> 6) +
                  ((ulong)(((ulong)pvVar9 & local_d0) < 0x8000000000000001) - 1)] &
                 (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
          }
          pvVar3 = (void *)CONCAT71(local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start._1_7_,
                                    local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start._0_1_);
          if (pvVar3 != (void *)0x0) {
            operator_delete(pvVar3,(long)local_1a8.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
          }
          pvVar9 = pvVar9 + 1;
        } while (local_c8 != pvVar9);
      }
      if (local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_0010a978;
      if (*(long *)(local_f0 + 1) != 0) {
        (**(code **)((long)local_f0 + 0x18))(local_f0,&local_178,&local_148);
        goto LAB_0010a978;
      }
      goto LAB_0010acc2;
    }
  }
  return;
LAB_0010a978:
  std::vector<double,_std::allocator<double>_>::vector
            (&local_1a8,local_e8,(allocator_type *)local_108);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_108,(size_type)local_180,&local_1a9);
  if (local_128 == 0) {
    local_120 = 0;
  }
  else {
    local_d8 = 0;
    dVar13 = 0.0;
    pvVar9 = (vector *)0x0;
    local_120 = 0;
    __src = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
    pdVar11 = local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      pvVar8 = pvVar9 + 0x3f;
      if (-1 < (long)pvVar9) {
        pvVar8 = pvVar9;
      }
      uVar7 = (ulong)(((ulong)pvVar9 & local_d0) < 0x8000000000000001);
      local_158 = dVar13;
      if ((local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[((long)pvVar8 >> 6) + (uVar7 - 1)] >>
           ((ulong)pvVar9 & 0x3f) & 1) == 0) {
LAB_0010aa9b:
        pTVar4 = local_118;
        lVar1 = *(long *)(local_118 + 8);
        local_190 = __src;
        if (lVar1 != 0) {
          memmove((void *)((long)local_158 * 8 +
                          CONCAT71(local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start._1_7_,
                                   local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start._0_1_)),
                  (void *)((local_d8 >> 0x20) * lVar1 * 8 + *(long *)(local_118 + 0x20)),lVar1 << 3)
          ;
        }
        *(undefined8 *)((long)local_108[0] + (long)pvVar9 * 8) =
             *(undefined8 *)(*(long *)(pTVar4 + 0x50) + (long)pvVar9 * 8);
        __src = local_190;
      }
      else {
        local_190 = (pointer)*pdVar11;
        local_70 = *(double *)(*(long *)(local_118 + 0x50) + (long)pvVar9 * 8);
        if ((double)local_190 <= local_70) {
          if ((get_random01->super__Function_base)._M_manager == (_Manager_type)0x0)
          goto LAB_0010acbd;
          dVar13 = (*get_random01->_M_invoker)((_Any_data *)get_random01);
          local_190 = (pointer)((double)local_190 - local_70);
          dVar13 = log(dVar13);
          if ((double)local_190 < dVar13) goto LAB_0010aa9b;
        }
        if (local_78 != 0) {
          memmove((void *)((long)local_158 * 8 +
                          CONCAT71(local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start._1_7_,
                                   local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start._0_1_)),__src,local_80);
        }
        *(double *)((long)local_108[0] + (long)pvVar9 * 8) = *pdVar11;
        local_120 = local_120 + 1;
      }
      uVar7 = 1L << ((byte)pvVar9 & 0x3f) &
              local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[((long)pvVar8 >> 6) + (uVar7 - 1)];
      pdVar11 = pdVar11 + (uVar7 != 0);
      if (uVar7 != 0) {
        uVar7 = local_c0;
      }
      __src = __src + uVar7;
      pvVar9 = pvVar9 + 1;
      dVar13 = (double)((long)local_158 + local_c0);
      local_d8 = local_d8 + 0x100000000;
    } while (local_c8 != pvVar9);
  }
  state = local_118;
  TasDREAM::TasmanianDREAM::setState((vector *)local_118);
  TasDREAM::TasmanianDREAM::setPDFvalues((vector *)state);
  if (local_184 <= local_1b0) {
    TasDREAM::TasmanianDREAM::saveStateHistory((ulong)state);
  }
  independent_update = (function<void_(std::vector<double,_std::allocator<double>_>_&)> *)local_90;
  iVar10 = local_10c;
  if (local_108[0] != (void *)0x0) {
    operator_delete(local_108[0],local_f8 - (long)local_108[0]);
  }
  pvVar3 = (void *)CONCAT71(local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_,
                            local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  if (local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1b0 = local_1b0 + 1;
  if (local_1b0 == iVar10) {
    return;
  }
  goto LAB_0010a6f7;
LAB_0010acbd:
  std::__throw_bad_function_call();
LAB_0010acc2:
  std::__throw_bad_function_call();
  goto LAB_0010acc7;
}

Assistant:

void SampleDREAM(int num_burnup, int num_collect,
                 DreamPDF probability_distribution,
                 DreamDomain inside,
                 TasmanianDREAM &state,
                 std::function<void(std::vector<double> &x)> independent_update = no_update,
                 std::function<double(void)> differential_update = const_one,
                 std::function<double(void)> get_random01 = tsgCoreUniform01){

    size_t num_chains = (size_t) state.getNumChains(), num_dimensions = (size_t) state.getNumDimensions();
    double unitlength = (double) num_chains;

    if (num_chains == 0) return; // no sampling with a null state

    if (!state.isStateReady()) throw std::runtime_error("ERROR: DREAM sampling requires that the setState() has been called first on the TasmanianDREAM.");

    if (!state.isPDFReady()) // initialize probability density (if not initialized already)
        state.setPDFvalues(probability_distribution);

    if (num_collect > 0) // pre-allocate memory for the new history
        state.expandHistory(num_collect);

    int total_iterations = std::max(num_burnup, 0) + std::max(num_collect, 0);
    for(int t = 0; t < total_iterations; t++){
        std::vector<double> candidates, values;
        candidates.reserve(num_chains * num_dimensions);
        values.reserve(num_chains);

        std::vector<bool> valid(num_chains, true); // keep track whether the samples need to be evaluated

        for(size_t i=0; i<num_chains; i++){
            std::vector<double> propose(num_dimensions);

            size_t jindex = (size_t) (get_random01() * unitlength);
            size_t kindex = (size_t) (get_random01() * unitlength);
            if (jindex >= num_chains) jindex = num_chains - 1; // this is needed in case get_random01() returns 1
            if (kindex >= num_chains) jindex = num_chains - 1;

            state.getIJKdelta(i, jindex, kindex, differential_update(), propose); // propose = s_i + w ( s_k - s_j)
            independent_update(propose); // propose += correction

            if (inside(propose)){
                candidates.insert(candidates.end(), propose.begin(), propose.end());
                values.resize(values.size() + 1);
            }else{
                valid[i] = false;
            }
        }

        if (!candidates.empty()) // block the pathological case of all proposals leaving the domain
            probability_distribution(candidates, values);

        std::vector<double> new_state(num_chains * num_dimensions), new_values(num_chains);

        auto icand = candidates.begin(); // loop over all candidates and values, accept or reject
        auto ival = values.begin();

        size_t accepted = 0;

        for(size_t i=0; i<num_chains; i++){
            bool keep_new = valid[i]; // if not valid, automatically reject
            if (valid[i]){ // apply random test
                if (*ival > state.getPDFvalue(i)){ // if the new value has higher probability, automatically accept
                    keep_new = true;
                }else{
                    if (form == regform){
                        keep_new = (*ival / state.getPDFvalue(i) >= get_random01()); // keep if the new value has higher probability
                    }else{
                        keep_new = (*ival - state.getPDFvalue(i) >= log(get_random01()));
                    }
                    //std::cout << "Trsh = " << *ival / state.getPDFvalue(i) << "   " << ((keep_new) ? "Accept" : "Reject") << std:: endl;
                }
            }

            if (keep_new){
                std::copy_n(icand, num_dimensions, new_state.begin() + i * num_dimensions);
                new_values[i] = *ival;
                accepted++; // accepted one more proposal
            }else{ // reject and reuse the old state
                state.getChainState((int) i, &*(new_state.begin() + i * num_dimensions));
                new_values[i] = state.getPDFvalue(i);
            }

            if (valid[i]){ // kept or rejected, if this sample was valid then move to the next sample in the list
                std::advance(icand, num_dimensions);
                ival++;
            }
        }

        state.setState(new_state);
        state.setPDFvalues(new_values);

        if (t >= num_burnup)
            state.saveStateHistory(accepted);
    }
}